

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

void __thiscall GGSock::Communicator::Data::~Data(Data *this)

{
  std::mutex::lock(&this->mutex);
  this->isListening = false;
  this->isConnected = false;
  this->isConnecting = false;
  this->isRunning = false;
  anon_unknown.dwarf_7a85::closeAndReset(&this->sdpeer);
  anon_unknown.dwarf_7a85::closeAndReset(&this->sd);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  if ((this->worker)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
  ::~_Rb_tree(&(this->messageCallback)._M_t);
  std::_Function_base::~_Function_base(&(this->errorCallback).super__Function_base);
  std::thread::~thread(&this->worker);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  ::~array(&this->ringBufferSend);
  return;
}

Assistant:

~Data() {
            {
                std::lock_guard<std::mutex> lock(mutex);
                isRunning = false;
                isConnected = false;
                isConnecting = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);
            }

            if (worker.joinable()) {
                worker.join();
            }
        }